

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O1

int Llb_NonlinFindBestVar(DdManager *dd,DdNode *bFunc,Aig_Man_t *pAig)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  DdManager *dd_00;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  DdNode *pDVar10;
  DdNode *n;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  timespec ts;
  long local_60;
  timespec local_50;
  Aig_Man_t *local_40;
  DdManager *local_38;
  
  local_38 = dd;
  iVar4 = clock_gettime(3,&local_50);
  if (iVar4 < 0) {
    local_60 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_60 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  uVar5 = Cudd_DagSize(bFunc);
  dd_00 = local_38;
  if (pAig->nRegs < 1) {
    uVar12 = 1000000000;
    uVar15 = 0xffffffff;
    uVar14 = 0xffffffff;
  }
  else {
    uVar12 = 1000000000;
    uVar14 = 0xffffffff;
    uVar16 = 0;
    uVar15 = 0xffffffff;
    local_40 = pAig;
    do {
      uVar11 = (uint)uVar12;
      uVar6 = pAig->nTruePis + uVar16;
      if (((int)uVar6 < 0) || (pAig->vCis->nSize <= (int)uVar6)) goto LAB_0083766b;
      pDVar10 = Cudd_bddIthVar(dd_00,*(int *)((long)pAig->vCis->pArray[uVar6] + 0x24));
      n = Cudd_bddAnd(dd_00,bFunc,(DdNode *)((ulong)pDVar10 ^ 1));
      Cudd_Ref(n);
      uVar6 = Cudd_DagSize(n);
      Cudd_RecursiveDeref(dd_00,n);
      pDVar10 = Cudd_bddAnd(dd_00,bFunc,pDVar10);
      Cudd_Ref(pDVar10);
      iVar7 = Cudd_DagSize(pDVar10);
      pAig = local_40;
      Cudd_RecursiveDeref(dd_00,pDVar10);
      iVar8 = uVar6 - iVar7;
      iVar4 = -iVar8;
      if (0 < iVar8) {
        iVar4 = iVar8;
      }
      uVar9 = (uVar6 - uVar5) + iVar7 + iVar4;
      bVar1 = 1 < (int)uVar6;
      bVar2 = 1 < iVar7;
      uVar3 = (uint)uVar15;
      if ((bVar2 && bVar1) && (int)uVar9 < (int)uVar11) {
        uVar3 = uVar6;
      }
      uVar15 = (ulong)uVar3;
      uVar6 = uVar11;
      if ((bVar2 && bVar1) && (int)uVar9 < (int)uVar11) {
        uVar6 = uVar9;
      }
      uVar12 = (ulong)uVar6;
      if ((bVar2 && bVar1) && (int)uVar9 < (int)uVar11) {
        uVar14 = uVar16;
      }
      uVar16 = uVar16 + 1;
    } while ((int)uVar16 < pAig->nRegs);
  }
  uVar16 = pAig->nTruePis + uVar14;
  if ((-1 < (int)uVar16) && ((int)uVar16 < pAig->vCis->nSize)) {
    printf("BestVar = %4d/%4d.  Value =%6d.  Orig =%6d. Size0 =%6d. ",(ulong)uVar14,
           (ulong)*(uint *)((long)pAig->vCis->pArray[uVar16] + 0x24),uVar12,(ulong)uVar5,uVar15);
    iVar7 = 3;
    iVar4 = clock_gettime(3,&local_50);
    if (iVar4 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Abc_Print(iVar7,"%s =","Time");
    Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar13 + local_60) / 1000000.0);
    return uVar14;
  }
LAB_0083766b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Llb_NonlinFindBestVar( DdManager * dd, DdNode * bFunc, Aig_Man_t * pAig )
{
    int fVerbose = 0;
    Aig_Obj_t * pObj;
    DdNode * bCof, * bVar;
    int i, iVar, iVarBest = -1, iValue, iValueBest = ABC_INFINITY, Size0Best = -1;
    int Size, Size0, Size1;
    abctime clk = Abc_Clock();
    Size = Cudd_DagSize(bFunc);
//    printf( "Original = %6d.  SuppSize = %3d. Vars = %3d.\n", 
//        Size = Cudd_DagSize(bFunc), Cudd_SupportSize(dd, bFunc), Aig_ManRegNum(pAig) );
    Saig_ManForEachLo( pAig, pObj, i )
    {
        iVar = Aig_ObjId(pObj);

if ( fVerbose )
printf( "Var =%3d : ", iVar );
        bVar = Cudd_bddIthVar(dd, iVar);

        bCof = Cudd_bddAnd( dd, bFunc, Cudd_Not(bVar) );          Cudd_Ref( bCof );
        Size0 = Cudd_DagSize(bCof);
if ( fVerbose )
printf( "Supp0 =%3d  ",  Cudd_SupportSize(dd, bCof) );
if ( fVerbose )
printf( "Size0 =%6d   ", Size0 );
        Cudd_RecursiveDeref( dd, bCof );

        bCof = Cudd_bddAnd( dd, bFunc, bVar );                    Cudd_Ref( bCof );
        Size1 = Cudd_DagSize(bCof);
if ( fVerbose )
printf( "Supp1 =%3d  ",  Cudd_SupportSize(dd, bCof) );
if ( fVerbose )
printf( "Size1 =%6d   ", Size1 );
        Cudd_RecursiveDeref( dd, bCof );

        iValue = Abc_MaxInt(Size0, Size1) - Abc_MinInt(Size0, Size1) + Size0 + Size1 - Size;
if ( fVerbose )
printf( "D =%6d  ", Size0 + Size1 - Size );
if ( fVerbose )
printf( "B =%6d  ", Abc_MaxInt(Size0, Size1) - Abc_MinInt(Size0, Size1) );
if ( fVerbose )
printf( "S =%6d\n", iValue );
        if ( Size0 > 1 && Size1 > 1 && iValueBest > iValue )
        {
            iValueBest = iValue;
            iVarBest   = i;
            Size0Best  = Size0;
        }
    }
    printf( "BestVar = %4d/%4d.  Value =%6d.  Orig =%6d. Size0 =%6d. ", 
        iVarBest, Aig_ObjId(Saig_ManLo(pAig,iVarBest)), iValueBest, Size, Size0Best );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return iVarBest;
}